

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O3

void __thiscall wasm::SafeHeap::addStoreFunc(SafeHeap *this,Store style,Module *module)

{
  MixedArena *this_00;
  Module *pMVar1;
  char *pcVar2;
  Name name;
  Type TVar3;
  Block *pBVar4;
  Function *pFVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  Binary *this_01;
  LocalSet *item;
  undefined1 *puVar8;
  ExpressionList *this_02;
  BinaryOp BVar9;
  Name name_00;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name name_01;
  Type local_98;
  Type local_90;
  HeapType local_88;
  SafeHeap *local_80;
  Block *local_78;
  Memory *local_70;
  Module *local_68;
  Type local_60;
  Builder builder;
  _Head_base<0UL,_wasm::Function_*,_false> local_48;
  Type local_40;
  allocator_type local_31;
  
  name_00 = getStoreName(&style);
  pFVar5 = Module::getFunctionOrNull(module,name_00);
  if (pFVar5 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_80 = this;
    local_70 = Module::getMemory(module,name);
    TVar3 = style.valueType;
    pMVar1 = (Module *)(local_70->addressType).id;
    types._M_len = 3;
    types._M_array = &stack0xffffffffffffffa0;
    local_60.id = (uintptr_t)pMVar1;
    builder.wasm = pMVar1;
    wasm::Type::Type(&local_98,types);
    sig.results.id = 0;
    sig.params.id = local_98.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = &local_90;
    local_90.id = (uintptr_t)pMVar1;
    local_40.id = (uintptr_t)pMVar1;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa0,__l,
               &local_31);
    name_01.super_IString.str._M_str = name_00.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&local_48;
    Builder::makeFunction
              (name_01,(HeapType)name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,
               (Expression *)&stack0xffffffffffffffa0);
    if ((Module *)local_60.id != (Module *)0x0) {
      operator_delete((void *)local_60.id,TVar3.id - local_60.id);
    }
    this_00 = &module->allocator;
    local_68 = module;
    local_60.id = (uintptr_t)module;
    local_78 = (Block *)MixedArena::allocSpace(this_00,0x40,8);
    (local_78->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (local_78->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (local_78->name).super_IString.str._M_len = 0;
    (local_78->name).super_IString.str._M_str = (char *)0x0;
    (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (local_78->list).allocator = this_00;
    BVar9 = AddInt64;
    if ((Module *)local_40.id != (Module *)0x3) {
      BVar9 = AddInt32;
    }
    pEVar6 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar6->_id = LocalGetId;
    *(undefined4 *)(pEVar6 + 1) = 0;
    (pEVar6->type).id = local_40.id;
    pEVar7 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar7->_id = LocalGetId;
    *(undefined4 *)(pEVar7 + 1) = 1;
    (pEVar7->type).id = local_40.id;
    this_01 = (Binary *)MixedArena::allocSpace(this_00,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar9;
    this_01->left = pEVar6;
    this_01->right = pEVar7;
    Binary::finalize(this_01);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffa0,3,(Expression *)this_01);
    this_02 = &local_78->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar6 = makeBoundsCheck(local_80,style.valueType,(Builder *)&stack0xffffffffffffffa0,0,3,
                             (uint)style.bytes,local_68,local_40,local_40.id == 3,
                             (Name)(local_70->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar6);
    if (1 < style.align.addr) {
      pEVar6 = makeAlignCheck(local_80,style.align,(Builder *)&stack0xffffffffffffffa0,3,local_68,
                              (Name)(local_70->super_Importable).super_Named.name.super_IString.str)
      ;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_02->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6)
      ;
    }
    pEVar6 = (Expression *)MixedArena::allocSpace(this_00,0x58,8);
    *(undefined8 *)pEVar6 = 0;
    (pEVar6->type).id = 0;
    *(undefined8 *)(pEVar6 + 2) = 0;
    pEVar6[2].type.id = 0;
    *(undefined8 *)(pEVar6 + 1) = 0;
    pEVar6[1].type.id = 0;
    *(undefined8 *)(pEVar6 + 3) = 0;
    pEVar6[3].type.id = 0;
    pEVar6->_id = StoreId;
    pEVar6[1].type.id = 0;
    *(undefined8 *)(pEVar6 + 2) = 0;
    *(undefined8 *)(pEVar6 + 4) = 0;
    pEVar6[4].type.id = 0;
    *(undefined8 *)(pEVar6 + 5) = 0;
    pEVar6->_id = style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._id;
    *(undefined7 *)&pEVar6->field_0x1 =
         style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._1_7_;
    (pEVar6->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.type.id;
    pEVar6[1]._id = style.bytes;
    pEVar6[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar6 + 2) = style.align.addr;
    pEVar6[2].type.id = style._40_8_;
    *(Expression **)(pEVar6 + 3) = style.ptr;
    pEVar6[3].type.id = (uintptr_t)style.value;
    *(uintptr_t *)(pEVar6 + 4) = style.valueType.id;
    pEVar6[4].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar6 + 5) = style.memory.super_IString.str._M_str;
    pcVar2 = (local_70->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar6[4].type.id = (local_70->super_Importable).super_Named.name.super_IString.str._M_len;
    *(char **)(pEVar6 + 5) = pcVar2;
    puVar8 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    TVar3 = style.valueType;
    *puVar8 = 8;
    *(undefined4 *)(puVar8 + 0x10) = 3;
    *(uintptr_t *)(puVar8 + 8) = local_40.id;
    *(undefined1 **)(pEVar6 + 3) = puVar8;
    puVar8 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    *puVar8 = 8;
    *(undefined4 *)(puVar8 + 0x10) = 2;
    *(uintptr_t *)(puVar8 + 8) = TVar3.id;
    pEVar6[3].type.id = (uintptr_t)puVar8;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar6);
    pBVar4 = local_78;
    Block::finalize(local_78,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
    (local_48._M_head_impl)->body = (Expression *)pBVar4;
    Module::addFunction(local_68,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )&local_48);
    if (local_48._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_48,local_48._M_head_impl);
    }
  }
  return;
}

Assistant:

void addStoreFunc(Store style, Module* module) {
    auto name = getStoreName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    bool is64 = memory->is64();
    // pointer, offset, value
    auto funcSig =
      Signature({addressType, addressType, style.valueType}, Type::none);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      3,
      builder.makeBinary(is64 ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.valueType,
                                          builder,
                                          0,
                                          3,
                                          style.bytes,
                                          module,
                                          addressType,
                                          is64,
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 3, module, memory->name));
    }
    // do the store
    auto* store = module->allocator.alloc<Store>();
    *store = style; // basically the same as the template we are given!
    store->memory = memory->name;
    store->ptr = builder.makeLocalGet(3, addressType);
    store->value = builder.makeLocalGet(2, style.valueType);
    block->list.push_back(store);
    block->finalize(Type::none);
    func->body = block;
    module->addFunction(std::move(func));
  }